

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

void attr_counter_set_free(mtree_writer *mtree)

{
  attr_counter_free(&(mtree->acs).uid_list);
  attr_counter_free(&(mtree->acs).gid_list);
  attr_counter_free(&(mtree->acs).mode_list);
  attr_counter_free(&(mtree->acs).flags_list);
  return;
}

Assistant:

static void
attr_counter_set_free(struct mtree_writer *mtree)
{
	struct att_counter_set *acs = &mtree->acs;

	attr_counter_free(&acs->uid_list);
	attr_counter_free(&acs->gid_list);
	attr_counter_free(&acs->mode_list);
	attr_counter_free(&acs->flags_list);
}